

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupRepres(Aig_Man_t *p)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  uint uVar6;
  int iVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  int *__dest;
  Vec_Ptr_t *pVVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pName = pcVar9;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar1);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar1);
  }
  p_00->pSpec = pcVar9;
  iVar7 = p->nBarBufs;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = iVar7;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar7 = pVVar2->nSize;
    pVVar10->nSize = iVar7;
    pVVar10->nCap = iVar7;
    if ((long)iVar7 == 0) {
      sVar8 = 0;
      __dest = (int *)0x0;
    }
    else {
      sVar8 = (long)iVar7 << 2;
      __dest = (int *)malloc(sVar8);
    }
    pVVar10->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,sVar8);
    p_00->vFlopNums = pVVar10;
  }
  Aig_ManCleanData(p);
  pVVar11 = p->vObjs;
  if (0 < pVVar11->nSize) {
    lVar15 = 0;
    do {
      pvVar3 = pVVar11->pArray[lVar15];
      if (pvVar3 != (void *)0x0) {
        uVar6 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if ((uVar6 & 7) - 7 < 0xfffffffe) {
          uVar6 = uVar6 & 7;
          if (uVar6 == 3) {
            uVar13 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if ((p->pReprs == (Aig_Obj_t **)0x0) ||
               (pAVar12 = p->pReprs[*(int *)(uVar13 + 0x24)], pAVar12 == (Aig_Obj_t *)0x0)) {
              uVar13 = *(ulong *)(uVar13 + 0x28);
            }
            else {
              uVar13 = (ulong)((*(uint *)&pAVar12->field_0x18 ^ *(uint *)(uVar13 + 0x18)) >> 3 & 1)
                       ^ (ulong)(pAVar12->field_5).pData;
            }
            pAVar12 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                           ((uint)*(ulong *)((long)pvVar3 + 8) & 1 ^ uVar13));
          }
          else if (uVar6 == 2) {
            pAVar12 = Aig_ObjCreateCi(p_00);
            *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar12;
            if ((p->pReprs != (Aig_Obj_t **)0x0) &&
               (pAVar4 = p->pReprs[*(int *)((long)pvVar3 + 0x24)], pAVar4 != (Aig_Obj_t *)0x0)) {
              pAVar12 = (Aig_Obj_t *)
                        ((ulong)((*(uint *)&pAVar4->field_0x18 ^ *(uint *)((long)pvVar3 + 0x18)) >>
                                 3 & 1) ^ (ulong)(pAVar4->field_5).pData);
            }
          }
          else {
            if (((ulong)pvVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar6 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                            ,0x3b5,"Aig_Man_t *Aig_ManDupRepres(Aig_Man_t *)");
            }
            pAVar12 = p_00->pConst1;
          }
        }
        else {
          ppAVar5 = p->pReprs;
          uVar13 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          uVar6 = (uint)*(ulong *)((long)pvVar3 + 8);
          if (ppAVar5 == (Aig_Obj_t **)0x0) {
            pAVar12 = (Aig_Obj_t *)((ulong)(uVar6 & 1) ^ *(ulong *)(uVar13 + 0x28));
            uVar13 = *(ulong *)((long)pvVar3 + 0x10);
            uVar14 = uVar13 & 0xfffffffffffffffe;
LAB_006bd0dc:
            uVar14 = *(ulong *)(uVar14 + 0x28);
          }
          else {
            pAVar12 = ppAVar5[*(int *)(uVar13 + 0x24)];
            if (pAVar12 == (Aig_Obj_t *)0x0) {
              pAVar12 = (Aig_Obj_t *)((ulong)(uVar6 & 1) ^ *(ulong *)(uVar13 + 0x28));
            }
            else {
              pAVar12 = (Aig_Obj_t *)
                        ((ulong)(uVar6 & 1) ^ (ulong)(pAVar12->field_5).pData ^
                        (ulong)((*(uint *)&pAVar12->field_0x18 ^ *(uint *)(uVar13 + 0x18)) >> 3 & 1)
                        );
            }
            uVar13 = *(ulong *)((long)pvVar3 + 0x10);
            uVar14 = uVar13 & 0xfffffffffffffffe;
            pAVar4 = ppAVar5[*(int *)(uVar14 + 0x24)];
            if (pAVar4 == (Aig_Obj_t *)0x0) goto LAB_006bd0dc;
            uVar14 = (ulong)((*(uint *)&pAVar4->field_0x18 ^ *(uint *)(uVar14 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar4->field_5).pData;
          }
          pAVar12 = Aig_And(p_00,pAVar12,(Aig_Obj_t *)((uint)uVar13 & 1 ^ uVar14));
        }
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar12;
      }
      lVar15 = lVar15 + 1;
      pVVar11 = p->vObjs;
    } while (lVar15 < pVVar11->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar7 = Aig_ManCheck(p_00);
  if (iVar7 == 0) {
    puts("Aig_ManDupRepres: Check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupRepres( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) );
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObj->pData = Aig_ObjCreateCi(pNew);
            pObj->pData = Aig_ObjGetRepres( p, pObj );
        }
        else if ( Aig_ObjIsCo(pObj) )
            pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Repres(p, pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->pData = Aig_ManConst1(pNew);
        else
            assert( 0 );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepres: Check has failed.\n" );
    return pNew;
}